

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFragCoordXYZCaseInstance *this)

{
  uint uVar1;
  uint uVar2;
  TextureLevel *this_00;
  float fVar3;
  float fVar4;
  float z_;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_e9;
  string local_e8;
  ConstPixelBufferAccess local_c8;
  undefined1 local_a0 [8];
  Vec4 resultColor;
  Vec4 color;
  Vec3 scaledFC;
  Vec3 fragCoord;
  float z;
  float yf;
  float xf;
  int x;
  int y;
  deUint16 local_44 [4];
  deUint16 indices [6];
  float precision;
  Vec3 scale;
  int height;
  int width;
  UVec2 viewportSize;
  BuiltinGlFragCoordXYZCaseInstance *this_local;
  
  viewportSize.m_data = (uint  [2])this;
  ShaderRenderCaseInstance::getViewportSize((ShaderRenderCaseInstance *)&height);
  uVar1 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&height);
  uVar2 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&height);
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)(indices + 4),1.0 / (float)(int)uVar1,1.0 / (float)(int)uVar2,1.0);
  indices[2] = 0xc5ac;
  indices[3] = 0x3727;
  local_44[0] = 2;
  local_44[1] = 1;
  local_44[2] = 3;
  local_44[3] = 0;
  indices[0] = 1;
  indices[1] = 2;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])();
  ShaderRenderCaseInstance::addUniform<tcu::Vector<float,3>>
            (&this->super_ShaderRenderCaseInstance,0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
             (Vector<float,_3> *)(indices + 4));
  ShaderRenderCaseInstance::getDefaultConstCoords();
  ShaderRenderCaseInstance::render(&this->super_ShaderRenderCaseInstance,4,2,local_44,(Vec4 *)&x);
  xf = 0.0;
  do {
    if ((int)uVar2 <= (int)xf) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"Result image matches reference",&local_121);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
      return __return_storage_ptr__;
    }
    for (yf = 0.0; (int)yf < (int)uVar1; yf = (float)((int)yf + 1)) {
      tcu::Vector<float,_3>::Vector
                ((Vector<float,_3> *)(scaledFC.m_data + 1),(float)(int)yf + 0.5,(float)(int)xf + 0.5
                 ,(((float)(int)yf + 0.5) / (float)(int)uVar1 +
                  ((float)(int)((uVar2 - (int)xf) + -1) + 0.5) / (float)(int)uVar2) / 2.0);
      tcu::operator*((tcu *)(color.m_data + 2),(Vector<float,_3> *)(scaledFC.m_data + 1),
                     (Vector<float,_3> *)(indices + 4));
      fVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(color.m_data + 2));
      fVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)(color.m_data + 2));
      z_ = tcu::Vector<float,_3>::z((Vector<float,_3> *)(color.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(resultColor.m_data + 2),fVar3,fVar4,z_,1.0)
      ;
      this_00 = ShaderRenderCaseInstance::getResultImage(&this->super_ShaderRenderCaseInstance);
      tcu::TextureLevel::getAccess(&local_c8,this_00);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_a0,(int)&local_c8,(int)yf,(int)xf);
      fVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(resultColor.m_data + 2));
      fVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_a0);
      fVar3 = de::abs<float>(fVar3 - fVar4);
      if (1e-05 < fVar3) {
LAB_00a5fe19:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Image mismatch",&local_e9);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        return __return_storage_ptr__;
      }
      fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(resultColor.m_data + 2));
      fVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_a0);
      fVar3 = de::abs<float>(fVar3 - fVar4);
      if (1e-05 < fVar3) goto LAB_00a5fe19;
      fVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(resultColor.m_data + 2));
      fVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_a0);
      fVar3 = de::abs<float>(fVar3 - fVar4);
      if (1e-05 < fVar3) goto LAB_00a5fe19;
    }
    xf = (float)((int)xf + 1);
  } while( true );
}

Assistant:

TestStatus BuiltinGlFragCoordXYZCaseInstance::iterate (void)
{
	const UVec2		viewportSize	= getViewportSize();
	const int		width			= viewportSize.x();
	const int		height			= viewportSize.y();
	const tcu::Vec3	scale			(1.f / float(width), 1.f / float(height), 1.0f);
	const float		precision		= 0.00001f;
	const deUint16	indices[6]		=
	{
		2, 1, 3,
		0, 1, 2,
	};

	setup();
	addUniform(0, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, scale);

	render(4, 2, indices);

	// Reference image
	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const float	xf			= (float(x) + .5f) / float(width);
			const float	yf			= (float(height - y - 1) + .5f) / float(height);
			const float	z			= (xf + yf) / 2.0f;
			const Vec3	fragCoord	(float(x) + .5f, float(y) + .5f, z);
			const Vec3	scaledFC	= fragCoord*scale;
			const Vec4	color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);
			const Vec4	resultColor	= getResultImage().getAccess().getPixel(x, y);

			if (de::abs(color.x() - resultColor.x()) > precision ||
				de::abs(color.y() - resultColor.y()) > precision ||
				de::abs(color.z() - resultColor.z()) > precision)
			return TestStatus::fail("Image mismatch");
		}
	}

	return TestStatus::pass("Result image matches reference");
}